

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseCommaSepArgs
               (int argc,char **argv,char *pattern,
               vector<doctest::String,_std::allocator<doctest::String>_> *res)

{
  undefined8 this;
  bool bVar1;
  char *__s;
  size_t sVar2;
  String local_88;
  char *local_70;
  char *pch;
  String local_58;
  undefined1 local_40 [8];
  String filtersString;
  vector<doctest::String,_std::allocator<doctest::String>_> *res_local;
  char *pattern_local;
  char **argv_local;
  int argc_local;
  
  filtersString.field_0._16_8_ = res;
  String::String((String *)local_40);
  String::String(&local_58);
  bVar1 = parseOption(argc,argv,pattern,(String *)local_40,&local_58);
  String::~String(&local_58);
  if (bVar1) {
    __s = String::c_str((String *)local_40);
    local_70 = strtok(__s,",");
    while (local_70 != (char *)0x0) {
      sVar2 = strlen(local_70);
      this = filtersString.field_0._16_8_;
      if (sVar2 != 0) {
        String::String(&local_88,local_70);
        std::vector<doctest::String,_std::allocator<doctest::String>_>::push_back
                  ((vector<doctest::String,_std::allocator<doctest::String>_> *)this,&local_88);
        String::~String(&local_88);
      }
      local_70 = strtok((char *)0x0,",");
    }
    argv_local._7_1_ = true;
  }
  else {
    argv_local._7_1_ = false;
  }
  String::~String((String *)local_40);
  return argv_local._7_1_;
}

Assistant:

bool parseCommaSepArgs(int argc, const char* const* argv, const char* pattern,
                           std::vector<String>& res) {
        String filtersString;
        if(parseOption(argc, argv, pattern, &filtersString)) {
            // tokenize with "," as a separator
            // cppcheck-suppress strtokCalled
            DOCTEST_CLANG_SUPPRESS_WARNING_WITH_PUSH("-Wdeprecated-declarations")
            auto pch = std::strtok(filtersString.c_str(), ","); // modifies the string
            while(pch != nullptr) {
                if(strlen(pch))
                    res.push_back(pch);
                // uses the strtok() internal state to go to the next token
                // cppcheck-suppress strtokCalled
                pch = std::strtok(nullptr, ",");
            }
            DOCTEST_CLANG_SUPPRESS_WARNING_POP
            return true;
        }
        return false;
    }